

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::AbortedRead::write
          (AbortedRead *this,int __fd,void *__buf,size_t __n)

{
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[28]>
            ((String *)&local_1c0,(Debug *)0x458868,"abortRead() has been called",(char (*) [28])__n
            );
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x59e,(String *)&local_1c0);
  Promise<void>::Promise((Promise<void> *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
      return KJ_EXCEPTION(DISCONNECTED, "abortRead() has been called");
    }